

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scaling.cpp
# Opt level: O0

void scale_rows(Runtime *rt)

{
  value_type vVar1;
  mapped_type_conflict1 *pmVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RDI;
  double dVar5;
  double dVar6;
  double dVar7;
  double factor_1;
  HighsInt row_1;
  double factor;
  HighsInt index_1;
  HighsInt var_1;
  HighsInt index;
  HighsInt var;
  HighsInt row;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> maxabscoefperrow;
  value_type in_stack_ffffffffffffff10;
  mapped_type_conflict1 *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int local_6c;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_3c;
  
  if ((*(byte *)(in_RDI + 0x8d0) & 1) != 0) {
    std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::map
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               0x7654c2);
    for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x408); local_3c = local_3c + 1) {
      pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            (key_type_conflict1 *)in_stack_ffffffffffffff48);
      *pmVar2 = 0.0;
    }
    for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x404); local_50 = local_50 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x588),(long)local_50);
      for (local_54 = *pvVar3;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x588),
                              (long)(local_50 + 1)), local_54 < *pvVar3; local_54 = local_54 + 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5b8),
                            (long)local_54);
        dVar5 = *pvVar4;
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a0),(long)local_54);
        pmVar2 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            (key_type_conflict1 *)in_stack_ffffffffffffff48);
        if (*pmVar2 <= ABS(dVar5) && ABS(dVar5) != *pmVar2) {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5b8),
                              (long)local_54);
          vVar1 = *pvVar4;
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a0),(long)local_54);
          pmVar2 = std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                (key_type_conflict1 *)in_stack_ffffffffffffff48);
          *pmVar2 = ABS(vVar1);
        }
      }
    }
    for (local_58 = 0; local_58 < *(int *)(in_RDI + 0x404); local_58 = local_58 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x588),(long)local_58);
      local_5c = *pvVar3;
      while (in_stack_ffffffffffffff54 = local_5c,
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x588),
                                (long)(local_58 + 1)), in_stack_ffffffffffffff54 < *pvVar3) {
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a0),(long)local_5c);
        in_stack_ffffffffffffff48 =
             std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        (key_type_conflict1 *)in_stack_ffffffffffffff48);
        dVar5 = largestpoweroftwo(in_stack_ffffffffffffff10);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5b8),
                            (long)local_5c);
        *pvVar4 = *pvVar4 / dVar5;
        local_5c = local_5c + 1;
      }
    }
    for (local_6c = 0; local_6c < *(int *)(in_RDI + 0x408); local_6c = local_6c + 1) {
      std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
      operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *
                 )CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (key_type_conflict1 *)in_stack_ffffffffffffff48);
      dVar6 = largestpoweroftwo(in_stack_ffffffffffffff10);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4f8),(long)local_6c
                         );
      dVar5 = *pvVar4;
      dVar7 = std::numeric_limits<double>::infinity();
      if (-dVar7 < dVar5) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4f8),
                            (long)local_6c);
        *pvVar4 = *pvVar4 / dVar6;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x510),(long)local_6c
                         );
      in_stack_ffffffffffffff10 = *pvVar4;
      dVar5 = std::numeric_limits<double>::infinity();
      if (in_stack_ffffffffffffff10 < dVar5) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x510),
                            (long)local_6c);
        *pvVar4 = *pvVar4 / dVar6;
      }
    }
    std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::~map
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               0x765a1f);
  }
  return;
}

Assistant:

static void scale_rows(Runtime& rt) {
  if (!rt.settings.rowscaling) {
    return;
  }

  std::map<HighsInt, double> maxabscoefperrow;
  for (HighsInt row = 0; row < rt.scaled.num_con; row++) {
    maxabscoefperrow[row] = 0.0;
  }

  for (HighsInt var = 0; var < rt.scaled.num_var; var++) {
    for (HighsInt index = rt.scaled.A.mat.start[var];
         index < rt.scaled.A.mat.start[var + 1]; index++) {
      if (fabs(rt.scaled.A.mat.value[index]) >
          maxabscoefperrow[rt.scaled.A.mat.index[index]]) {
        maxabscoefperrow[rt.scaled.A.mat.index[index]] =
            fabs(rt.scaled.A.mat.value[index]);
      }
    }
  }

  for (HighsInt var = 0; var < rt.scaled.num_var; var++) {
    for (HighsInt index = rt.scaled.A.mat.start[var];
         index < rt.scaled.A.mat.start[var + 1]; index++) {
      double factor =
          largestpoweroftwo(maxabscoefperrow[rt.scaled.A.mat.index[index]]);
      rt.scaled.A.mat.value[index] /= factor;
    }
  }

  for (HighsInt row = 0; row < rt.scaled.num_con; row++) {
    double factor = largestpoweroftwo(maxabscoefperrow[row]);
    if (rt.scaled.con_lo[row] > -std::numeric_limits<double>::infinity()) {
      rt.scaled.con_lo[row] /= factor;
    }
    if (rt.scaled.con_up[row] < std::numeric_limits<double>::infinity()) {
      rt.scaled.con_up[row] /= factor;
    }
  }
}